

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O1

CURLcode Curl_bufref_memdup(bufref *br,void *ptr,size_t len)

{
  uchar *__dest;
  
  if (ptr == (void *)0x0) {
    __dest = (uchar *)0x0;
  }
  else {
    __dest = (uchar *)(*Curl_cmalloc)(len + 1);
    if (__dest == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (len != 0) {
      memcpy(__dest,ptr,len);
    }
    __dest[len] = '\0';
  }
  if ((br->ptr != (uchar *)0x0) && (br->dtor != (_func_void_void_ptr *)0x0)) {
    (*br->dtor)(br->ptr);
  }
  br->dtor = (_func_void_void_ptr *)0x0;
  br->ptr = (uchar *)0x0;
  br->ptr = __dest;
  br->len = len;
  br->dtor = curl_free;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_bufref_memdup(struct bufref *br, const void *ptr, size_t len)
{
  unsigned char *cpy = NULL;

  DEBUGASSERT(br);
  DEBUGASSERT(br->signature == SIGNATURE);
  DEBUGASSERT(br->ptr || !br->len);
  DEBUGASSERT(ptr || !len);
  DEBUGASSERT(len <= CURL_MAX_INPUT_LENGTH);

  if(ptr) {
    cpy = malloc(len + 1);
    if(!cpy)
      return CURLE_OUT_OF_MEMORY;
    if(len)
      memcpy(cpy, ptr, len);
    cpy[len] = '\0';
  }

  Curl_bufref_set(br, cpy, len, curl_free);
  return CURLE_OK;
}